

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

GenericFunctionInstanceTypeResponse * __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::find(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
       *this,GenericFunctionInstanceTypeRequest *key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Node *this_00;
  GenericFunctionInstanceTypeRequest local_68;
  
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar4 = key->hash;
    uVar3 = 0;
    do {
      uVar4 = uVar4 & uVar1 - 1;
      this_00 = this->data + uVar4;
      local_68.hash = 0;
      local_68.aliases.head = (MatchData *)0x0;
      local_68.aliases.tail = (MatchData *)0x0;
      local_68.arguments.head = (TypeHandle *)0x0;
      local_68.arguments.tail = (TypeHandle *)0x0;
      local_68.parentType = (TypeBase *)0x0;
      local_68.function = (FunctionData *)0x0;
      bVar2 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
      if (bVar2) {
        return (GenericFunctionInstanceTypeResponse *)0x0;
      }
      bVar2 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
      if (bVar2) {
        return &this_00->value;
      }
      uVar4 = uVar4 + uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->bucketCount);
  }
  return (GenericFunctionInstanceTypeResponse *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}